

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::TimingControlExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,TimingControlExpressionSyntax *this,size_t index)

{
  SyntaxNode *pSVar1;
  size_t index_local;
  TimingControlExpressionSyntax *this_local;
  
  if (index == 0) {
    pSVar1 = &not_null<slang::syntax::TimingControlSyntax_*>::get(&this->timing)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else if (index == 1) {
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,pSVar1);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax TimingControlExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return timing.get();
        case 1: return expr.get();
        default: return nullptr;
    }
}